

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall slang::ast::Compilation::resolveDefParamsAndBinds(Compilation *this)

{
  string_view detail;
  string_view name;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  SourceLocation SVar4;
  Symbol *this_00;
  reference pOVar5;
  pointer pRVar6;
  long in_RDI;
  SourceRange SVar7;
  SourceRange SVar8;
  Diagnostic *diag;
  OverrideEntry *prevEntry;
  anon_class_16_2_9473209d getRange;
  Symbol *target;
  SyntaxNode *targetNode;
  size_t j;
  DefParamVisitor v_1;
  Compilation c;
  uint32_t i;
  bool allSame;
  DefParamVisitor v;
  anon_class_24_3_a558fa90 nextIt;
  size_t currBlocksSeen;
  Compilation initialClone;
  size_t numDefParamsSeen;
  size_t numBindsSeen;
  size_t numBlocksSeen;
  size_t generateLevel;
  anon_class_8_1_8991fb9c checkProblem;
  anon_class_24_3_8f1a74c6 saveState;
  anon_class_16_2_91181a89 cloneInto;
  anon_class_24_3_973e07f5 copyStateInto;
  anon_class_1_0_00000001 getNodeFor;
  SmallVector<BindEntry,_2UL> binds;
  SmallVector<OverrideEntry,_4UL> overrides;
  TimeTraceScope timeScope;
  undefined4 in_stack_ffffffffffffdfd8;
  int in_stack_ffffffffffffdfdc;
  undefined4 in_stack_ffffffffffffdfe0;
  int in_stack_ffffffffffffdfe4;
  DefParamVisitor *in_stack_ffffffffffffdfe8;
  SourceLocation in_stack_ffffffffffffdff0;
  SourceLocation in_stack_ffffffffffffdff8;
  undefined7 in_stack_ffffffffffffe000;
  undefined1 in_stack_ffffffffffffe007;
  Symbol *in_stack_ffffffffffffe008;
  DefParamVisitor *in_stack_ffffffffffffe010;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffe018;
  SourceLocation in_stack_ffffffffffffe038;
  SourceLocation in_stack_ffffffffffffe040;
  SourceLocation SVar9;
  SourceLocation index;
  DiagCode in_stack_ffffffffffffe134;
  undefined1 in_stack_ffffffffffffe20f;
  Compilation *in_stack_ffffffffffffe210;
  anon_class_24_3_973e07f5 *in_stack_ffffffffffffe218;
  Compilation *in_stack_ffffffffffffe420;
  DefParamVisitor *in_stack_ffffffffffffe428;
  anon_class_24_3_8f1a74c6 *in_stack_ffffffffffffe430;
  undefined1 in_stack_ffffffffffffed57;
  Compilation *in_stack_ffffffffffffed58;
  uint local_119c;
  int local_1194;
  SmallVectorBase<const_slang::ast::DefParamSymbol_*> local_1190 [4];
  size_t local_1108;
  anon_class_24_3_a558fa90 local_10e8;
  size_t local_10d0 [3];
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  SourceLibrary *in_stack_fffffffffffff298;
  Bag *in_stack_fffffffffffff2a0;
  Compilation *in_stack_fffffffffffff2a8;
  vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
  avStack_680 [24];
  size_type local_430;
  size_type local_428;
  size_t local_420 [3];
  SmallVectorBase<OverrideEntry> *local_408;
  undefined1 *local_400;
  SmallVectorBase<OverrideEntry> **local_3e8;
  SmallVectorBase<OverrideEntry> *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  undefined1 local_3c1;
  undefined1 local_3c0 [280];
  SmallVectorBase<OverrideEntry> local_2a8 [3];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20 = sv((char *)CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
                CONCAT44(in_stack_ffffffffffffdfdc,in_stack_ffffffffffffdfd8));
  local_30 = sv((char *)CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
                CONCAT44(in_stack_ffffffffffffdfdc,in_stack_ffffffffffffdfd8));
  name._M_str = (char *)in_stack_ffffffffffffe010;
  name._M_len = (size_t)in_stack_ffffffffffffe008;
  detail._M_str._0_7_ = in_stack_ffffffffffffe000;
  detail._M_len = (size_t)in_stack_ffffffffffffdff8;
  detail._M_str._7_1_ = in_stack_ffffffffffffe007;
  TimeTraceScope::TimeTraceScope((TimeTraceScope *)in_stack_ffffffffffffdff0,name,detail);
  SmallVector<OverrideEntry,_4UL>::SmallVector((SmallVector<OverrideEntry,_4UL> *)0x8a509a);
  SmallVector<BindEntry,_2UL>::SmallVector((SmallVector<BindEntry,_2UL> *)0x8a50a7);
  SVar7.endLoc = in_stack_ffffffffffffe038;
  SVar7.startLoc = in_stack_ffffffffffffe040;
  SVar8.endLoc = in_stack_ffffffffffffdff0;
  SVar8.startLoc = in_stack_ffffffffffffdff8;
  local_3c1 = 0;
  local_3e0 = local_2a8;
  local_3d8 = &local_3c1;
  local_3d0 = local_3c0;
  local_3e8 = &local_3e0;
  local_408 = local_2a8;
  local_400 = local_3c0;
  local_420[1] = 0;
  local_420[0] = 0;
  local_428 = 0;
  local_430 = 0;
  do {
    local_1098 = 0;
    uStack_1090 = 0;
    local_10a8 = 0;
    uStack_10a0 = 0;
    local_10b8 = 0;
    uStack_10b0 = 0;
    Bag::Bag((Bag *)0x8a518e);
    Compilation(in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
    Bag::~Bag((Bag *)0x8a51c3);
    resolveDefParamsAndBinds::anon_class_16_2_91181a89::operator()
              ((anon_class_16_2_91181a89 *)SVar7.startLoc,(Compilation *)SVar7.endLoc);
    local_10e8.currBlocksSeen = local_10d0;
    local_10e8.numBlocksSeen = local_420;
    local_10e8.generateLevel = local_420 + 1;
    do {
      DefParamVisitor::DefParamVisitor
                ((DefParamVisitor *)CONCAT17(in_stack_ffffffffffffe007,in_stack_ffffffffffffe000),
                 (size_t)SVar8.startLoc,(size_t)SVar8.endLoc);
      getRoot(in_stack_ffffffffffffed58,(bool)in_stack_ffffffffffffed57);
      Symbol::visit<slang::ast::DefParamVisitor&>((Symbol *)SVar8.endLoc,in_stack_ffffffffffffdfe8);
      bVar1 = resolveDefParamsAndBinds::anon_class_8_1_8991fb9c::operator()
                        (in_stack_ffffffffffffe018,in_stack_ffffffffffffe010);
      if (bVar1) {
        local_1194 = 1;
      }
      else {
        local_10d0[0] = local_1108;
        sVar3 = SmallVectorBase<const_slang::ast::DefParamSymbol_*>::size(local_1190);
        if ((local_430 < sVar3) ||
           (sVar3 = std::
                    vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                    ::size(avStack_680), local_428 < sVar3)) {
          local_430 = SmallVectorBase<const_slang::ast::DefParamSymbol_*>::size(local_1190);
          resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                    (in_stack_ffffffffffffe430,in_stack_ffffffffffffe428,in_stack_ffffffffffffe420);
          local_1194 = 5;
        }
        else {
          bVar1 = resolveDefParamsAndBinds::anon_class_24_3_a558fa90::operator()(&local_10e8);
          if (bVar1) {
            resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                      (in_stack_ffffffffffffe430,in_stack_ffffffffffffe428,in_stack_ffffffffffffe420
                      );
            local_1194 = 5;
          }
          else {
            local_1194 = 0;
          }
        }
      }
      DefParamVisitor::~DefParamVisitor
                ((DefParamVisitor *)CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
    } while (local_1194 == 0);
    if (local_1194 == 5) {
      sVar3 = std::
              vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
              ::size(avStack_680);
      if (local_428 < sVar3) {
        local_430 = 0;
        local_428 = std::
                    vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                    ::size(avStack_680);
        local_1194 = 2;
      }
      else {
        bVar1 = true;
        for (local_119c = 0; local_119c < *(uint *)(in_RDI + 0x2c); local_119c = local_119c + 1) {
          Bag::Bag((Bag *)0x8a54e7);
          Compilation(in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298)
          ;
          Bag::~Bag((Bag *)0x8a551c);
          resolveDefParamsAndBinds::anon_class_16_2_91181a89::operator()
                    ((anon_class_16_2_91181a89 *)SVar7.startLoc,(Compilation *)SVar7.endLoc);
          DefParamVisitor::DefParamVisitor
                    ((DefParamVisitor *)
                     CONCAT17(in_stack_ffffffffffffe007,in_stack_ffffffffffffe000),
                     (size_t)SVar8.startLoc,(size_t)SVar8.endLoc);
          getRoot(in_stack_ffffffffffffed58,(bool)in_stack_ffffffffffffed57);
          Symbol::visit<slang::ast::DefParamVisitor&>
                    ((Symbol *)SVar8.endLoc,in_stack_ffffffffffffdfe8);
          bVar2 = resolveDefParamsAndBinds::anon_class_8_1_8991fb9c::operator()
                            (in_stack_ffffffffffffe018,in_stack_ffffffffffffe010);
          if (bVar2) {
            local_1194 = 1;
          }
          else {
            bVar1 = true;
            SVar9 = (SourceLocation)0x0;
            while (index = SVar9,
                  SVar4 = (SourceLocation)
                          SmallVectorBase<const_slang::ast::DefParamSymbol_*>::size
                                    ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)
                                     &stack0xffffffffffffe130), (ulong)SVar9 < (ulong)SVar4) {
              SVar9 = (SourceLocation)0x0;
              SmallVectorBase<const_slang::ast::DefParamSymbol_*>::operator[]
                        ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)
                         &stack0xffffffffffffe130,(size_type)index);
              this_00 = DefParamSymbol::getTarget
                                  ((DefParamSymbol *)
                                   CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
              if (this_00 != (Symbol *)0x0) {
                SVar9 = (SourceLocation)Symbol::getSyntax(this_00);
              }
              pOVar5 = SmallVectorBase<OverrideEntry>::operator[](local_2a8,(size_type)index);
              if (((pOVar5->targetSyntax != (SyntaxNode *)0x0) && (SVar9 != (SourceLocation)0x0)) &&
                 ((SourceLocation)pOVar5->targetSyntax != SVar9)) {
                std::
                unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
                operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                            *)0x8a5780);
                SVar7 = resolveDefParamsAndBinds::anon_class_16_2_9473209d::operator()
                                  ((anon_class_16_2_9473209d *)
                                   CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
                sourceRange.endLoc = index;
                sourceRange.startLoc = SVar9;
                Scope::addDiag((Scope *)this_00,in_stack_ffffffffffffe134,sourceRange);
                Diagnostic::operator<<
                          ((Diagnostic *)
                           CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
                           (string *)CONCAT44(in_stack_ffffffffffffdfdc,in_stack_ffffffffffffdfd8));
                Symbol::getHierarchicalPath_abi_cxx11_(in_stack_ffffffffffffe008);
                Diagnostic::operator<<
                          ((Diagnostic *)
                           CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
                           (string *)CONCAT44(in_stack_ffffffffffffdfdc,in_stack_ffffffffffffdfd8));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
                local_1194 = 1;
                goto LAB_008a59fa;
              }
              in_stack_ffffffffffffe010 = (DefParamVisitor *)&pOVar5->value;
              in_stack_ffffffffffffe018 =
                   (anon_class_8_1_8991fb9c *)
                   SmallVectorBase<const_slang::ast::DefParamSymbol_*>::operator[]
                             ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)
                              &stack0xffffffffffffe130,(size_type)index);
              in_stack_ffffffffffffe008 =
                   (Symbol *)
                   DefParamSymbol::getValue
                             ((DefParamSymbol *)
                              CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
              in_stack_ffffffffffffe007 =
                   slang::operator==((ConstantValue *)
                                     CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
                                     (ConstantValue *)
                                     CONCAT44(in_stack_ffffffffffffdfdc,in_stack_ffffffffffffdfd8));
              if (((in_stack_ffffffffffffe007 ^ 0xff) & 1) != 0) {
                bVar1 = false;
                if (local_119c == *(int *)(in_RDI + 0x2c) - 1U) {
                  pRVar6 = std::
                           unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                           ::operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                         *)0x8a5930);
                  in_stack_ffffffffffffdfe8 = (DefParamVisitor *)&pRVar6->super_Scope;
                  SVar8 = resolveDefParamsAndBinds::anon_class_16_2_9473209d::operator()
                                    ((anon_class_16_2_9473209d *)
                                     CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
                  sourceRange_00.endLoc = index;
                  sourceRange_00.startLoc = SVar9;
                  Scope::addDiag((Scope *)this_00,in_stack_ffffffffffffe134,sourceRange_00);
                }
                break;
              }
              SVar9 = (SourceLocation)((long)index + 1);
            }
            if (bVar1) {
              local_1194 = 6;
            }
            else {
              resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                        (in_stack_ffffffffffffe430,in_stack_ffffffffffffe428,
                         in_stack_ffffffffffffe420);
              local_1194 = 0;
            }
          }
LAB_008a59fa:
          DefParamVisitor::~DefParamVisitor
                    ((DefParamVisitor *)
                     CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
          ~Compilation((Compilation *)CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0))
          ;
          in_stack_ffffffffffffdfe4 = local_1194;
          if (local_1194 != 0) {
            if (local_1194 != 6) goto LAB_008a5ab6;
            break;
          }
        }
        if (bVar1) {
          bVar1 = resolveDefParamsAndBinds::anon_class_24_3_a558fa90::operator()(&local_10e8);
          in_stack_ffffffffffffdfe0 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffdfe0);
          if (bVar1) {
            local_1194 = 3;
          }
          else {
            local_1194 = 0;
          }
        }
        else {
          local_1194 = 3;
        }
      }
    }
LAB_008a5ab6:
    ~Compilation((Compilation *)CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
    in_stack_ffffffffffffdfdc = local_1194;
    if ((local_1194 != 0) && (local_1194 != 2)) {
      if (local_1194 == 3) {
        resolveDefParamsAndBinds::anon_class_24_3_973e07f5::operator()
                  (in_stack_ffffffffffffe218,in_stack_ffffffffffffe210,
                   (bool)in_stack_ffffffffffffe20f);
      }
      SmallVector<BindEntry,_2UL>::~SmallVector((SmallVector<BindEntry,_2UL> *)0x8a5b36);
      SmallVector<OverrideEntry,_4UL>::~SmallVector((SmallVector<OverrideEntry,_4UL> *)0x8a5b43);
      TimeTraceScope::~TimeTraceScope((TimeTraceScope *)0x8a5b50);
      return;
    }
  } while( true );
}

Assistant:

void Compilation::resolveDefParamsAndBinds() {
    TimeTraceScope timeScope("resolveDefParamsAndBinds"sv, ""sv);

    struct OverrideEntry {
        OpaqueInstancePath path;
        const SyntaxNode* targetSyntax = nullptr;
        const SyntaxNode* defparamSyntax = nullptr;
        ConstantValue value;
        std::string pathStr;
    };
    SmallVector<OverrideEntry, 4> overrides;

    struct BindEntry {
        OpaqueInstancePath path;
        const ModuleDeclarationSyntax* definitionTarget = nullptr;
        BindDirectiveInfo info;
    };
    SmallVector<BindEntry> binds;

    auto getNodeFor = [](const OpaqueInstancePath& path, Compilation& c) {
        HierarchyOverrideNode* node = &c.hierarchyOverrides;
        for (auto& entry : path.entries)
            node = &node->childNodes[entry];
        return node;
    };

    auto copyStateInto = [&](Compilation& c, bool isFinal) {
        for (auto& entry : overrides) {
            if (!entry.targetSyntax)
                continue;

            SLANG_ASSERT(entry.defparamSyntax);

            auto node = getNodeFor(entry.path, c);
            auto [it, inserted] = node->paramOverrides.emplace(
                entry.targetSyntax, std::pair{entry.value, entry.defparamSyntax});

            if (!inserted && isFinal) {
                SLANG_ASSERT(it->second.second);
                auto& diag = c.root->addDiag(diag::DuplicateDefparam,
                                             entry.defparamSyntax->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, it->second.second->sourceRange());
            }
        }

        for (auto& entry : binds) {
            if (entry.definitionTarget) {
                if (!entry.path.empty()) {
                    // This is a nested definition, so we need to put the
                    // bind into the override node.
                    auto node = getNodeFor(entry.path, c);
                    node->binds.push_back({entry.info, entry.definitionTarget});
                }
                else {
                    auto def = c.getDefinition(*c.root, *entry.definitionTarget);
                    if (def) {
                        // const_cast is fine; we accessed the private data of the compilation
                        // through a public interface that added the const on top.
                        const_cast<DefinitionSymbol*>(def)->bindDirectives.push_back(entry.info);
                    }
                }
            }
            else {
                auto node = getNodeFor(entry.path, c);
                node->binds.push_back({entry.info, nullptr});
            }
        }
    };

    auto cloneInto = [&](Compilation& c) {
        c.diagsDisabled = true;
        c.options = options;
        for (auto& tree : syntaxTrees)
            c.addSyntaxTree(tree);

        copyStateInto(c, false);
    };

    auto saveState = [&](DefParamVisitor& visitor, Compilation& c) {
        overrides.clear();
        for (auto defparam : visitor.found) {
            auto target = defparam->getTarget();
            if (!target) {
                overrides.emplace_back();
            }
            else {
                overrides.push_back({OpaqueInstancePath(*target), target->getSyntax(),
                                     defparam->getSyntax(), defparam->getValue(),
                                     target->getHierarchicalPath()});
            }
        }

        // We make a copy of the bind directives list here because resolveBindTargets
        // can cause the compilation to add more entries to the list (for recursive
        // module instantiations).
        binds.clear();
        auto bindDirs = c.bindDirectives;
        for (auto [syntax, scope] : bindDirs) {
            ResolvedBind resolvedBind;
            c.resolveBindTargets(*syntax, *scope, resolvedBind);

            BindDirectiveInfo info;
            info.bindSyntax = syntax;

            auto& def = resolvedBind.instanceDef;
            info.configRuleSyntax = def.configRule ? def.configRule->syntax.get() : nullptr;
            info.configBlockSyntax = def.configRoot ? def.configRoot->getSyntax() : nullptr;
            info.instantiationDefSyntax = def.definition ? def.definition->getSyntax() : nullptr;
            info.isNewConfigRoot = def.configRoot != nullptr;
            if (!info.isNewConfigRoot && resolvedBind.resolvedConfig) {
                info.configBlockSyntax = resolvedBind.resolvedConfig->useConfig.getSyntax();

                // Make a copy of the list; the memory for it is owned by
                // the old compilation that is going away.
                info.liblist = copyFrom(resolvedBind.resolvedConfig->liblist);
            }

            for (auto target : resolvedBind.instTargets)
                binds.emplace_back(BindEntry{OpaqueInstancePath(*target), nullptr, info});

            if (auto defTarget = resolvedBind.defTarget) {
                auto parentScope = defTarget->getParentScope();
                auto defSyntax = defTarget->getSyntax();
                SLANG_ASSERT(parentScope && defSyntax);

                // If this is a nested definition we'll put it into the
                // override node of the parent scope that contains the
                // definition. Otherwise it's a globally targeted bind.
                OpaqueInstancePath path;
                auto& parentSym = parentScope->asSymbol();
                if (parentSym.kind != SymbolKind::CompilationUnit)
                    path = OpaqueInstancePath(parentSym);

                binds.emplace_back(
                    BindEntry{std::move(path), &defSyntax->as<ModuleDeclarationSyntax>(), info});
            }
        }
    };

    auto checkProblem = [&](const DefParamVisitor& visitor) {
        if (visitor.hierarchyProblem) {
            auto& diag = root->addDiag(diag::MaxInstanceDepthExceeded,
                                       visitor.hierarchyProblem->location);
            diag << visitor.hierarchyProblem->getDefinition().getKindString();
            diag << options.maxInstanceDepth;
            return true;
        }
        return false;
    };

    // [23.10.4.1] gives an algorithm for elaboration in the face of defparams.
    // Specifically, we need to resolve all possible defparams at one "level" of
    // hierarchy before moving on to a deeper level, where a "level" in this case
    // is each successive set of nested generate blocks.
    size_t generateLevel = 0;
    size_t numBlocksSeen = 0;
    size_t numBindsSeen = 0;
    size_t numDefParamsSeen = 0;
    while (true) {
        // Traverse the design and find all defparams and their values.
        // defparam resolution happens in a cloned compilation unit because we will be
        // constantly mucking with parameter values in ways that can change the actual
        // hierarchy that gets instantiated. Cloning lets us do that in an isolated context
        // and throw that work away once we know the final parameter values.
        Compilation initialClone({}, defaultLibPtr);
        cloneInto(initialClone);

        size_t currBlocksSeen;
        auto nextIt = [&] {
            // If we haven't found any new blocks we're done iterating.
            SLANG_ASSERT(currBlocksSeen >= numBlocksSeen);
            if (currBlocksSeen == numBlocksSeen)
                return true;

            // Otherwise advance into the next blocks and try again.
            generateLevel++;
            numBlocksSeen = currBlocksSeen;
            return false;
        };

        while (true) {
            DefParamVisitor v(options.maxInstanceDepth, generateLevel);
            initialClone.getRoot(/* skipDefParamsAndBinds */ true).visit(v);
            if (checkProblem(v))
                return;

            currBlocksSeen = v.numBlocksSeen;
            if (v.found.size() > numDefParamsSeen ||
                initialClone.bindDirectives.size() > numBindsSeen) {
                numDefParamsSeen = v.found.size();
                saveState(v, initialClone);
                break;
            }

            // We didn't find any more binds or defparams so increase
            // our generate level and try again.
            if (nextIt()) {
                saveState(v, initialClone);
                break;
            }
        }

        // If we have found more binds, do another visit to let them be applied
        // and potentially add blocks and defparams to our set for this level.
        if (initialClone.bindDirectives.size() > numBindsSeen) {
            // Reset the number of defparams seen to ensure that
            // we re-resolve everything after the next iteration.
            numDefParamsSeen = 0;
            numBindsSeen = initialClone.bindDirectives.size();
            continue;
        }

        // defparams can change the value of parameters, further affecting the value of
        // other defparams elsewhere in the design. This means we need to iterate,
        // reevaluating defparams until they all settle to a stable value or until we
        // give up due to the potential of cyclical references.
        bool allSame = true;
        for (uint32_t i = 0; i < options.maxDefParamSteps; i++) {
            Compilation c({}, defaultLibPtr);
            cloneInto(c);

            DefParamVisitor v(options.maxInstanceDepth, generateLevel);
            c.getRoot(/* skipDefParamsAndBinds */ true).visit(v);
            if (checkProblem(v))
                return;

            // We're only done if we have the same set of defparams with the same set of values.
            allSame = true;
            SLANG_ASSERT(v.found.size() == overrides.size());
            for (size_t j = 0; j < v.found.size(); j++) {
                // Check that the defparam resolved to the same target we saw previously.
                // The spec declares it to be an error if a defparam target changes based
                // on elaboration of other defparam values.
                const SyntaxNode* targetNode = nullptr;
                auto target = v.found[j]->getTarget();
                if (target)
                    targetNode = target->getSyntax();

                auto getRange = [&] {
                    auto syntax = v.found[j]->getSyntax();
                    SLANG_ASSERT(syntax);
                    return syntax->sourceRange();
                };

                auto& prevEntry = overrides[j];
                if (prevEntry.targetSyntax && targetNode && prevEntry.targetSyntax != targetNode) {
                    auto& diag = root->addDiag(diag::DefParamTargetChange, getRange());
                    diag << prevEntry.pathStr;
                    diag << target->getHierarchicalPath();
                    return;
                }

                if (prevEntry.value != v.found[j]->getValue()) {
                    allSame = false;
                    if (i == options.maxDefParamSteps - 1)
                        root->addDiag(diag::DefParamCycle, getRange());
                    break;
                }
            }

            if (allSame)
                break;

            saveState(v, c);
        }

        // If we gave up due to a potential infinite loop, continue exiting.
        if (!allSame)
            break;

        if (nextIt())
            break;
    }

    // We have our final overrides; copy them into the main compilation unit.
    copyStateInto(*this, true);
}